

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

void clearexp(void)

{
  expentry *peVar1;
  expentry **ppeVar2;
  expentry *__ptr;
  exphead *peVar3;
  
  while (__ptr = ehead.tqh_first, ehead.tqh_first != (expentry *)0x0) {
    peVar1 = ((ehead.tqh_first)->eentry).tqe_next;
    peVar3 = (exphead *)peVar1;
    if (peVar1 == (expentry *)0x0) {
      peVar3 = &ehead;
    }
    ppeVar2 = ((ehead.tqh_first)->eentry).tqe_prev;
    (((expentry *)peVar3)->eentry).tqe_prev = ppeVar2;
    *ppeVar2 = peVar1;
    free(__ptr->fun);
    free(__ptr);
  }
  return;
}

Assistant:

static void
clearexp(void)
{
	struct expentry	*e1 = NULL;

	while (!TAILQ_EMPTY(&ehead)) {
		e1 = TAILQ_FIRST(&ehead);
		TAILQ_REMOVE(&ehead, e1, eentry);
		free(e1->fun);
		free(e1);
	}
	return;
}